

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O2

FilterInfo * __thiscall
helics::FilterFederate::createFilter
          (FilterFederate *this,GlobalBrokerId dest,InterfaceHandle handle,string_view key,
          string_view type_in,string_view type_out,bool cloning)

{
  BaseType BVar1;
  unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_> local_58;
  GlobalHandle local_4c;
  undefined1 local_44 [12];
  char *local_38;
  
  local_38 = key._M_str;
  local_44._4_8_ = key._M_len;
  BVar1 = (this->mFedID).gid;
  local_4c.fed_id.gid = dest.gid;
  if ((this->mCoreID).gid == dest.gid) {
    local_4c.fed_id.gid = BVar1;
  }
  if (dest.gid == 0) {
    local_4c.fed_id.gid = BVar1;
  }
  local_44._0_4_ = handle.hid;
  std::
  make_unique<helics::FilterInfo,helics::GlobalBrokerId,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,bool>
            ((GlobalBrokerId *)&local_58,(InterfaceHandle *)&local_4c,
             (basic_string_view<char,_std::char_traits<char>_> *)local_44,
             (basic_string_view<char,_std::char_traits<char>_> *)(local_44 + 4),&type_in,
             (bool *)&type_out);
  local_4c.fed_id.gid =
       *(BaseType *)
        local_58._M_t.
        super___uniq_ptr_impl<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>._M_t.
        super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>.
        super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl;
  *(bool *)((long)local_58._M_t.
                  super___uniq_ptr_impl<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                  .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 0x99) = cloning
  ;
  local_4c.handle.hid = local_44._0_4_;
  gmlc::containers::MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle>::insert
            (&this->filters,&local_4c,&local_58);
  std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>::~unique_ptr
            (&local_58);
  return (FilterInfo *)
         (tuple<helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>)
         local_58._M_t.
         super___uniq_ptr_impl<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>._M_t.
         super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>.
         super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl;
}

Assistant:

FilterInfo* FilterFederate::createFilter(GlobalBrokerId dest,
                                         InterfaceHandle handle,
                                         std::string_view key,
                                         std::string_view type_in,
                                         std::string_view type_out,
                                         bool cloning)
{
    auto filt = std::make_unique<FilterInfo>((dest == parent_broker_id || dest == mCoreID) ?
                                                 GlobalBrokerId(mFedID) :
                                                 dest,
                                             handle,
                                             key,
                                             type_in,
                                             type_out,
                                             false);

    auto cid = filt->core_id;
    auto* retTarget = filt.get();
    // auto actualKey = key;
    retTarget->cloning = cloning;
    // if (actualKey.empty()) {
    // actualKey = "sFilter_";
    // actualKey.append(std::to_string(handle.baseValue()));
    // }

    // if (filt->core_id == mFedID) {
    filters.insert({cid, handle}, std::move(filt));
    //} else {
    // actualKey.push_back('_');
    //  actualKey.append(std::to_string(cid.baseValue()));
    //    filters.insert({cid, handle}, std::move(filt));
    //}

    return retTarget;
}